

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O1

void __thiscall
TEST_MockSupportTest_setDataForBooleanValues_Test::testBody
          (TEST_MockSupportTest_setDataForBooleanValues_Test *this)

{
  bool bVar1;
  bool bVar2;
  MockSupport *pMVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  char *pcVar7;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  MockNamedValue local_c0;
  MockNamedValue local_70;
  
  SimpleString::SimpleString((SimpleString *)&local_c0,"");
  pMVar3 = mock((SimpleString *)&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_70,"data");
  MockSupport::setData(pMVar3,(SimpleString *)&local_70,true);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  SimpleString::SimpleString((SimpleString *)&local_70,"");
  pMVar3 = mock((SimpleString *)&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_100,"data");
  MockSupport::getData(&local_c0,pMVar3,&local_100);
  bVar1 = MockNamedValue::getBoolValue(&local_c0);
  MockNamedValue::~MockNamedValue(&local_c0);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  if (bVar1) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
               ,0x43,pTVar5);
  }
  else {
    SimpleString::SimpleString(&local_100,"");
    pMVar3 = mock(&local_100,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_e0,"data");
    MockSupport::getData(&local_c0,pMVar3,&local_e0);
    bVar1 = MockNamedValue::getBoolValue(&local_c0);
    SimpleString::SimpleString(&local_f0,"");
    pMVar3 = mock(&local_f0,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_d0,"data");
    MockSupport::getData(&local_70,pMVar3,&local_d0);
    bVar2 = MockNamedValue::getBoolValue(&local_70);
    MockNamedValue::~MockNamedValue(&local_70);
    SimpleString::~SimpleString(&local_d0);
    SimpleString::~SimpleString(&local_f0);
    MockNamedValue::~MockNamedValue(&local_c0);
    SimpleString::~SimpleString(&local_e0);
    SimpleString::~SimpleString(&local_100);
    if (bVar1 != bVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
                 ,0x43);
    }
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_70,0));
    pcVar6 = SimpleString::asCharString((SimpleString *)&local_70);
    SimpleString::SimpleString(&local_e0,"");
    pMVar3 = mock(&local_e0,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_f0,"data");
    MockSupport::getData(&local_c0,pMVar3,&local_f0);
    MockNamedValue::getBoolValue(&local_c0);
    ::StringFrom(false);
    pcVar7 = SimpleString::asCharString(&local_100);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
               ,0x43,pTVar5);
    SimpleString::~SimpleString(&local_100);
    MockNamedValue::~MockNamedValue(&local_c0);
    SimpleString::~SimpleString(&local_f0);
    SimpleString::~SimpleString(&local_e0);
    SimpleString::~SimpleString((SimpleString *)&local_70);
  }
  return;
}

Assistant:

TEST(MockSupportTest, setDataForBooleanValues)
{
    bool expected_data = true;
    mock().setData("data", expected_data);
    CHECK_EQUAL(expected_data, mock().getData("data").getBoolValue());
}